

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_structs.c
# Opt level: O0

exr_result_t
internal_exr_add_part(_internal_exr_context *f,_internal_exr_part **outpart,int *new_index)

{
  int iVar1;
  int iVar2;
  exr_result_t eVar3;
  undefined4 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  int p;
  _internal_exr_part **nptrs;
  _internal_exr_part *part;
  int ncount;
  int local_3c;
  long local_38;
  void *local_30;
  
  iVar1 = *(int *)(in_RDI + 0xc4);
  iVar2 = iVar1 + 1;
  if (in_RDX != (undefined4 *)0x0) {
    *in_RDX = *(undefined4 *)(in_RDI + 0xc4);
  }
  if (iVar2 == 1) {
    local_30 = (void *)(in_RDI + 200);
    *(void **)(in_RDI + 0x1d0) = local_30;
    local_38 = in_RDI + 0x1d0;
  }
  else {
    local_30 = (void *)(**(code **)(in_RDI + 0x58))(0x108);
    if (local_30 == (void *)0x0) {
      eVar3 = (**(code **)(in_RDI + 0x38))(in_RDI,1);
      return eVar3;
    }
    local_38 = (**(code **)(in_RDI + 0x58))((long)iVar2 << 3);
    if (local_38 == 0) {
      (**(code **)(in_RDI + 0x60))(local_30);
      eVar3 = (**(code **)(in_RDI + 0x38))(in_RDI,1);
      return eVar3;
    }
    memset(local_30,0,0x108);
  }
  *(undefined4 *)((long)local_30 + 4) = 4;
  *(undefined4 *)((long)local_30 + 0x98) = 0xffffffff;
  *(undefined4 *)((long)local_30 + 0x9c) = 0xffffffff;
  *(undefined4 *)((long)local_30 + 0xa8) = 0xffffffff;
  *(undefined4 *)((long)local_30 + 0xac) = 0xffffffff;
  *(undefined4 *)((long)local_30 + 0xf4) = 0xffffffff;
  *(undefined4 *)((long)local_30 + 0xb8) = *(undefined4 *)(in_RDI + 0x78);
  *(undefined4 *)((long)local_30 + 0xbc) = *(undefined4 *)(in_RDI + 0x7c);
  if (1 < iVar2) {
    for (local_3c = 0; local_3c < *(int *)(in_RDI + 0xc4); local_3c = local_3c + 1) {
      *(undefined8 *)(local_38 + (long)local_3c * 8) =
           *(undefined8 *)(*(long *)(in_RDI + 0x1d8) + (long)local_3c * 8);
    }
    *(void **)(local_38 + (long)iVar1 * 8) = local_30;
  }
  if (1 < *(int *)(in_RDI + 0xc4)) {
    (**(code **)(in_RDI + 0x60))(*(undefined8 *)(in_RDI + 0x1d8));
  }
  *(long *)(in_RDI + 0x1d8) = local_38;
  *(int *)(in_RDI + 0xc4) = iVar2;
  if (in_RSI != (undefined8 *)0x0) {
    *in_RSI = local_30;
  }
  return 0;
}

Assistant:

exr_result_t
internal_exr_add_part (
    struct _internal_exr_context* f,
    struct _internal_exr_part**   outpart,
    int*                          new_index)
{
    int                         ncount = f->num_parts + 1;
    struct _internal_exr_part*  part;
    struct _internal_exr_part** nptrs = NULL;

    if (new_index) *new_index = f->num_parts;

    if (ncount == 1)
    {
        /* no need to zilch, the parent struct will have already been zero'ed */
        part         = &(f->first_part);
        f->init_part = part;
        nptrs        = &(f->init_part);
    }
    else
    {
        part = (struct _internal_exr_part*) f->alloc_fn (sizeof (struct _internal_exr_part));
        if (!part) return f->standard_error (f, EXR_ERR_OUT_OF_MEMORY);

        nptrs = (struct _internal_exr_part**)
            f->alloc_fn (sizeof (struct _internal_exr_part*) * (size_t) ncount);
        if (!nptrs)
        {
            f->free_fn (part);
            return f->standard_error (f, EXR_ERR_OUT_OF_MEMORY);
        }
        memset(part, 0, sizeof(struct _internal_exr_part));
    }

    /* assign appropriately invalid values */
    part->storage_mode         = EXR_STORAGE_LAST_TYPE;
    part->data_window.max.x    = -1;
    part->data_window.max.y    = -1;
    part->display_window.max.x = -1;
    part->display_window.max.y = -1;
    part->chunk_count          = -1;

    part->zip_compression_level = f->default_zip_level;
    part->dwa_compression_level = f->default_dwa_quality;

    /* put it into the part table */
    if (ncount > 1)
    {
        for (int p = 0; p < f->num_parts; ++p)
        {
            nptrs[p] = f->parts[p];
        }
        nptrs[ncount - 1] = part;
    }

    if (f->num_parts > 1) { f->free_fn (f->parts); }
    f->parts     = nptrs;
    f->num_parts = ncount;
    if (outpart) *outpart = part;

    return EXR_ERR_SUCCESS;
}